

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

wstring * __thiscall
mjs::number_to_exponential_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int f)

{
  bool bVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  int local_1ec;
  size_type e_pos;
  size_type e_pos_1;
  long local_1a8;
  wstringstream wss;
  wostream local_198 [380];
  int local_1c;
  double dStack_18;
  int f_local;
  double x_local;
  __string_type *s;
  
  local_1c = (int)this;
  dStack_18 = x;
  x_local = (double)__return_storage_ptr__;
  bVar1 = std::isfinite(x);
  bVar5 = false;
  if ((bVar1) && (bVar5 = false, -1 < local_1c)) {
    bVar5 = local_1c < 0x15;
  }
  if (!bVar5) {
    __assert_fail("std::isfinite(x) && f >= 0 && f <= 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0xae,"std::wstring mjs::number_to_exponential(double, int)");
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&local_1a8);
  if (dStack_18 < 0.0) {
    dStack_18 = -dStack_18;
    std::operator<<(local_198,L'-');
  }
  if (local_1c == 0) {
    local_1ec = 0x12;
  }
  else {
    local_1ec = local_1c;
  }
  std::ios_base::precision
            ((ios_base *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)),(long)local_1ec);
  std::ios_base::flags((ios_base *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)),_S_scientific);
  std::wostream::operator<<(local_198,dStack_18);
  std::__cxx11::wstringstream::str();
  if (local_1c == 0) {
    e_pos = std::__cxx11::wstring::find_last_of((wchar_t)__return_storage_ptr__,0x65);
    if (e_pos == 0xffffffffffffffff || e_pos == 0) {
      __assert_fail("e_pos != std::wstring::npos && e_pos > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                    ,0xbc,"std::wstring mjs::number_to_exponential(double, int)");
    }
    while( true ) {
      e_pos = e_pos - 1;
      piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      if (*piVar2 == 0x2e) break;
      piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      if (*piVar2 != 0x30) goto LAB_00190fcc;
      std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,e_pos);
    }
    std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,e_pos);
  }
LAB_00190fcc:
  lVar3 = std::__cxx11::wstring::find_last_of((wchar_t)__return_storage_ptr__,0x65);
  bVar5 = false;
  if (lVar3 != -1) {
    uVar4 = std::__cxx11::wstring::length();
    bVar5 = false;
    if (lVar3 + 2U < uVar4) {
      piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      bVar5 = true;
      if (*piVar2 != 0x2b) {
        piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
        bVar5 = *piVar2 == 0x2d;
      }
    }
  }
  if (bVar5) {
    while( true ) {
      uVar4 = std::__cxx11::wstring::length();
      bVar5 = false;
      if (lVar3 + 3U < uVar4) {
        piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
        bVar5 = *piVar2 == 0x30;
      }
      if (!bVar5) break;
      std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,lVar3 + 2);
    }
    std::__cxx11::wstringstream::~wstringstream((wstringstream *)&local_1a8);
    return __return_storage_ptr__;
  }
  __assert_fail("e_pos != std::wstring::npos && e_pos+2 < s.length() && (s[e_pos+1] == \'+\' || s[e_pos+1] == \'-\')"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0xcc,"std::wstring mjs::number_to_exponential(double, int)");
}

Assistant:

std::wstring number_to_exponential(double x, int f) {
    // TODO: Implement actual rules from ES3, 15.7.4.6
    assert(std::isfinite(x) && f >= 0 && f <= 20);
    std::wstringstream wss;
    if (x < 0) {
        x = -x;
        wss << L'-';
    }
    wss.precision(f ? f : 18);
    wss.flags(std::ios::scientific);
    wss << x;
    auto s = wss.str();

    // Remove unnecessary digits (yuck)
    if (f == 0) {
        auto e_pos = s.find_last_of(L'e');
        assert(e_pos != std::wstring::npos && e_pos > 0);
        for (;;) {
            --e_pos;
            if (s[e_pos] == '.') {
                s.erase(e_pos, 1);
                break;
            }
            if (s[e_pos] != '0') {
                break;
            }
            s.erase(e_pos, 1);
        }
    }

    // Fix up the exponent to match ECMAscript format (yuck)
    auto e_pos = s.find_last_of(L'e');
    assert(e_pos != std::wstring::npos && e_pos+2 < s.length() && (s[e_pos+1] == '+' || s[e_pos+1] == '-'));
    e_pos += 2;

    // Remove leading zeros in exponent
    while (e_pos + 1 < s.length() && s[e_pos] == L'0') {
        s.erase(e_pos, 1);
    }

    return s;
}